

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AstToYaml.cpp
# Opt level: O3

void MyCompiler::Util::processAst<MyCompiler::ProcedureDeclaration>
               (ProcedureDeclaration *ast,int level,
               vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *items,string *name)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Block *ast_00;
  int iVar2;
  long *plVar3;
  long *plVar4;
  size_type *psVar5;
  int local_94;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  long *local_50 [2];
  long local_40 [2];
  
  local_94 = level;
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"- ident: \"","");
  plVar3 = (long *)std::__cxx11::string::_M_append
                             ((char *)local_50,
                              (ulong)(((ast->pIdent).
                                       super___shared_ptr<MyCompiler::Ident,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr)->super_AbstractAstNode).value._M_dataplus._M_p);
  plVar4 = plVar3 + 2;
  if ((long *)*plVar3 == plVar4) {
    local_60 = *plVar4;
    lStack_58 = plVar3[3];
    local_70 = &local_60;
  }
  else {
    local_60 = *plVar4;
    local_70 = (long *)*plVar3;
  }
  local_68 = plVar3[1];
  *plVar3 = (long)plVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_70);
  paVar1 = &local_90.field_2;
  psVar5 = (size_type *)(plVar3 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar3 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar5) {
    local_90.field_2._M_allocated_capacity = *psVar5;
    local_90.field_2._8_8_ = plVar3[3];
    local_90._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_90.field_2._M_allocated_capacity = *psVar5;
    local_90._M_dataplus._M_p = (pointer)*plVar3;
  }
  local_90._M_string_length = plVar3[1];
  *plVar3 = (long)psVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  std::
  vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>::
  emplace_back<int&,std::__cxx11::string>
            ((vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>
              *)items,&local_94,&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar1) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if (local_70 != &local_60) {
    operator_delete(local_70,local_60 + 1);
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  iVar2 = local_94;
  ast_00 = (ast->pBlock).super___shared_ptr<MyCompiler::Block,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_90._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"block","");
  processAst<MyCompiler::Block>(ast_00,iVar2 + 1,items,&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar1) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void MyCompiler::Util::processAst<MyCompiler::ProcedureDeclaration>(
        ProcedureDeclaration &ast, int level,
        std::vector<std::pair<int, std::string>> &items, const std::string &name)
{
    items.emplace_back(level, std::string("- ident: \"") + ast.pIdent->value + "\"");
    processAst(*ast.pBlock, level + 1, items, "block");
}